

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O1

void ucnv_extGetUnicodeSet_63
               (UConverterSharedData *sharedData,USetAdder *sa,UConverterUnicodeSet which,
               UConverterSetFilter filter,UErrorCode *pErrorCode)

{
  ushort uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  uint length;
  UConverterSharedData *pUVar6;
  ulong uVar7;
  ulong uVar8;
  uint minLength;
  ulong uVar9;
  UChar *s_00;
  UConverterUnicodeSet which_00;
  ushort *puVar10;
  long lVar11;
  UConverterSharedData *sharedData_00;
  UChar s [19];
  
  pUVar6 = (UConverterSharedData *)(sharedData->mbcs).extIndexes;
  if (pUVar6 != (UConverterSharedData *)0x0) {
    uVar2 = *(uint *)&pUVar6->field_0x2c;
    which_00 = UCNV_SET_COUNT|UCNV_ROUNDTRIP_AND_FALLBACK_SET;
    if (filter != UCNV_SET_FILTER_2022_CN) {
      which_00 = (filter != UCNV_SET_FILTER_NONE || (sharedData->mbcs).outputType == 0xdb) +
                 UCNV_ROUNDTRIP_AND_FALLBACK_SET;
    }
    if (0 < (int)uVar2) {
      uVar3 = pUVar6->toUnicodeStatus;
      uVar4 = (pUVar6->mbcs).countToUFallbacks;
      iVar5 = *(int *)((long)&(pUVar6->mbcs).stateTable + 4);
      uVar9 = 0;
      uVar7 = (ulong)(filter - UCNV_SET_FILTER_2022_CN);
      minLength = 0;
      sharedData_00 = pUVar6;
      do {
        uVar1 = *(ushort *)((long)(pUVar6->mbcs).sbcsIndex + uVar9 * 2 + (long)(int)uVar3 + -0x68);
        if ((int)uVar2 < (int)(uint)uVar1) {
          lVar11 = 0;
          do {
            uVar8 = (ulong)*(ushort *)
                            ((long)(pUVar6->mbcs).sbcsIndex +
                            lVar11 * 2 + (ulong)uVar1 * 2 + (long)(int)uVar3 + -0x68);
            if (uVar8 == 0) {
              minLength = minLength + 0x10;
            }
            else {
              puVar10 = (ushort *)
                        ((long)(pUVar6->mbcs).sbcsIndex + uVar8 * 8 + (long)(int)uVar4 + -0x68);
              do {
                length = *(uint *)((long)(pUVar6->mbcs).sbcsIndex +
                                  (ulong)*puVar10 * 4 + (long)iVar5 + -0x68);
                if (length != 0) {
                  if (length < 0x1000000) {
                    if (minLength < 0x10000) {
                      s_00 = (UChar *)0x1;
                      s[0] = (UChar)minLength;
                    }
                    else {
                      s[0] = (short)(minLength >> 10) + L'ퟀ';
                      s[1] = (UChar)minLength & 0x3ffU | 0xdc00;
                      s_00 = (UChar *)0x2;
                    }
                    ucnv_extGetUnicodeSetString
                              (sharedData_00,(int32_t *)sa,(USetAdder *)(ulong)which,which_00,
                               minLength,(UChar32)s,s_00,length,(uint)uVar7,
                               (UErrorCode *)sharedData_00);
                  }
                  else if (((which != UCNV_ROUNDTRIP_SET) && ((length >> 0x1d & 1) == 0)) &&
                          (which_00 <= (length >> 0x18 & 0x1f))) {
                    if ((uint)uVar7 < 4) {
                      switch((long)&switchD_003978d9::switchdataD_003f9654 +
                             (long)(int)(&switchD_003978d9::switchdataD_003f9654)[uVar7]) {
                      case 0x3978db:
                        if ((length & 0x1f000000) == 0x3000000 && (length & 0xff0000) < 0x830000)
                        goto LAB_003979a9;
                        break;
                      case 0x397902:
                        if (((length & 0x1f000000) == 0x2000000) &&
                           ((length + 0x5e5f & 0xfffe) < 0x5d5e)) {
joined_r0x00397978:
                          if ((length + 0x5f & 0xfe) < 0x5e) goto LAB_003979a9;
                        }
                        break;
                      case 0x397941:
                        if (((length & 0x1f000000) == 0x2000000) &&
                           ((length + 0x5e5f & 0xfffe) < 0x5c5e)) goto joined_r0x00397978;
                        break;
                      case 0x397980:
                        if (((length & 0x1f000000) == 0x2000000) &&
                           ((length & 0xffffff) - 0x8140 < 0x6ebd)) goto LAB_003979a9;
                      }
                    }
                    else {
LAB_003979a9:
                      (*(code *)sa->add)(sa->set,minLength);
                    }
                  }
                }
                puVar10 = puVar10 + 1;
                minLength = minLength + 1;
              } while ((minLength & 0xf) != 0);
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0x40);
        }
        else {
          minLength = minLength + 0x400;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar2);
    }
  }
  return;
}

Assistant:

U_CFUNC void
ucnv_extGetUnicodeSet(const UConverterSharedData *sharedData,
                      const USetAdder *sa,
                      UConverterUnicodeSet which,
                      UConverterSetFilter filter,
                      UErrorCode *pErrorCode) {
    const int32_t *cx;
    const uint16_t *stage12, *stage3, *ps2, *ps3;
    const uint32_t *stage3b;

    uint32_t value;
    int32_t st1, stage1Length, st2, st3, minLength;

    UChar s[UCNV_EXT_MAX_UCHARS];
    UChar32 c;
    int32_t length;

    cx=sharedData->mbcs.extIndexes;
    if(cx==NULL) {
        return;
    }

    stage12=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_STAGE_12_INDEX, uint16_t);
    stage3=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_STAGE_3_INDEX, uint16_t);
    stage3b=UCNV_EXT_ARRAY(cx, UCNV_EXT_FROM_U_STAGE_3B_INDEX, uint32_t);

    stage1Length=cx[UCNV_EXT_FROM_U_STAGE_1_LENGTH];

    /* enumerate the from-Unicode trie table */
    c=0; /* keep track of the current code point while enumerating */

    if(filter==UCNV_SET_FILTER_2022_CN) {
        minLength=3;
    } else if( sharedData->mbcs.outputType==MBCS_OUTPUT_DBCS_ONLY ||
               filter!=UCNV_SET_FILTER_NONE
    ) {
        /* DBCS-only, ignore single-byte results */
        minLength=2;
    } else {
        minLength=1;
    }

    /*
     * the trie enumeration is almost the same as
     * in MBCSGetUnicodeSet() for MBCS_OUTPUT_1
     */
    for(st1=0; st1<stage1Length; ++st1) {
        st2=stage12[st1];
        if(st2>stage1Length) {
            ps2=stage12+st2;
            for(st2=0; st2<64; ++st2) {
                if((st3=(int32_t)ps2[st2]<<UCNV_EXT_STAGE_2_LEFT_SHIFT)!=0) {
                    /* read the stage 3 block */
                    ps3=stage3+st3;

                    do {
                        value=stage3b[*ps3++];
                        if(value==0) {
                            /* no mapping, do nothing */
                        } else if(UCNV_EXT_FROM_U_IS_PARTIAL(value)) {
                            // Recurse for partial results.
                            length=0;
                            U16_APPEND_UNSAFE(s, length, c);
                            ucnv_extGetUnicodeSetString(
                                sharedData, cx, sa, which, minLength,
                                c, s, length,
                                (int32_t)UCNV_EXT_FROM_U_GET_PARTIAL_INDEX(value),
                                pErrorCode);
                        } else if(extSetUseMapping(which, minLength, value)) {
                            switch(filter) {
                            case UCNV_SET_FILTER_2022_CN:
                                if(!(UCNV_EXT_FROM_U_GET_LENGTH(value)==3 && UCNV_EXT_FROM_U_GET_DATA(value)<=0x82ffff)) {
                                    continue;
                                }
                                break;
                            case UCNV_SET_FILTER_SJIS:
                                if(!(UCNV_EXT_FROM_U_GET_LENGTH(value)==2 && (value=UCNV_EXT_FROM_U_GET_DATA(value))>=0x8140 && value<=0xeffc)) {
                                    continue;
                                }
                                break;
                            case UCNV_SET_FILTER_GR94DBCS:
                                if(!(UCNV_EXT_FROM_U_GET_LENGTH(value)==2 &&
                                     (uint16_t)((value=UCNV_EXT_FROM_U_GET_DATA(value))-0xa1a1)<=(0xfefe - 0xa1a1) &&
                                     (uint8_t)(value-0xa1)<=(0xfe - 0xa1))) {
                                    continue;
                                }
                                break;
                            case UCNV_SET_FILTER_HZ:
                                if(!(UCNV_EXT_FROM_U_GET_LENGTH(value)==2 &&
                                     (uint16_t)((value=UCNV_EXT_FROM_U_GET_DATA(value))-0xa1a1)<=(0xfdfe - 0xa1a1) &&
                                     (uint8_t)(value-0xa1)<=(0xfe - 0xa1))) {
                                    continue;
                                }
                                break;
                            default:
                                /*
                                 * UCNV_SET_FILTER_NONE,
                                 * or UCNV_SET_FILTER_DBCS_ONLY which is handled via minLength
                                 */
                                break;
                            }
                            sa->add(sa->set, c);
                        }
                    } while((++c&0xf)!=0);
                } else {
                    c+=16; /* empty stage 3 block */
                }
            }
        } else {
            c+=1024; /* empty stage 2 block */
        }
    }
}